

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.h
# Opt level: O0

void __thiscall
TPZFYsmpMatrix<std::complex<double>_>::SetData
          (TPZFYsmpMatrix<std::complex<double>_> *this,TPZVec<long> *IA,TPZVec<long> *JA,
          TPZVec<std::complex<double>_> *A)

{
  int64_t iVar1;
  int64_t iVar2;
  TPZVec<std::complex<double>_> *copy;
  long *plVar3;
  TPZVec<long> *in_RDX;
  TPZVec<long> *in_RSI;
  TPZBaseMatrix *in_RDI;
  size_t in_stack_000003d8;
  char *in_stack_000003e0;
  
  iVar1 = TPZVec<long>::size(in_RSI);
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar1 != iVar2 + 1) {
    pzinternal::DebugStopImpl(in_stack_000003e0,in_stack_000003d8);
  }
  copy = (TPZVec<std::complex<double>_> *)TPZVec<long>::size(in_RDX);
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  plVar3 = TPZVec<long>::operator[](in_RSI,iVar1);
  if (copy != (TPZVec<std::complex<double>_> *)*plVar3) {
    pzinternal::DebugStopImpl(in_stack_000003e0,in_stack_000003d8);
  }
  TPZVec<long>::operator=((TPZVec<long> *)in_RDI,(TPZVec<long> *)copy);
  TPZVec<long>::operator=((TPZVec<long> *)in_RDI,(TPZVec<long> *)copy);
  TPZVec<std::complex<double>_>::operator=((TPZVec<std::complex<double>_> *)in_RDI,copy);
  return;
}

Assistant:

inline void TPZFYsmpMatrix<TVar>::SetData( TPZVec<int64_t> &IA, TPZVec<int64_t> &JA, TPZVec<TVar> &A ){
    
    if (IA.size() != this->Rows() + 1 ) {
        DebugStop();
    }
    
    if (JA.size() != IA[this->Rows()]) {
        DebugStop();
    }
    
    fIA = IA;
    fJA = JA;
    fA = A;
}